

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O2

string * get_path_from_template
                   (string *__return_storage_ptr__,string *template_string,string *file_name,
                   uint64_t time,uint64_t number)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string b;
  string c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string rep_name;
  string rep_str;
  string time_str;
  string number_str;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&number_str,"$Number$",(allocator<char> *)&time_str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&time_str,"$Time$",(allocator<char> *)&rep_str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rep_str,"$RepresentationID$",(allocator<char> *)&rep_name);
  rep_name._M_dataplus._M_p = (pointer)&rep_name.field_2;
  rep_name._M_string_length = 0;
  rep_name.field_2._M_local_buf[0] = '\0';
  if (file_name->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::find_last_of((char *)file_name,0x113091);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&b,(ulong)file_name);
      std::__cxx11::string::operator=((string *)&rep_name,(string *)&b);
      std::__cxx11::string::~string((string *)&b);
    }
  }
  lVar1 = std::__cxx11::string::find_first_of((string *)template_string,(ulong)&rep_str);
  if (lVar1 != -1) {
    b._M_dataplus._M_p = (pointer)&b.field_2;
    b._M_string_length = 0;
    c._M_dataplus._M_p = (pointer)&c.field_2;
    c._M_string_length = 0;
    b.field_2._M_local_buf[0] = '\0';
    c.field_2._M_local_buf[0] = '\0';
    if (lVar1 != 0) {
      std::__cxx11::string::substr((ulong)&local_150,(ulong)template_string);
      std::__cxx11::string::operator=((string *)&b,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    if (rep_str._M_string_length + lVar1 < template_string->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_150,(ulong)template_string);
      std::__cxx11::string::operator=((string *)&c,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::operator+(&local_f0,&b,&rep_name);
    std::operator+(&local_150,&local_f0,&c);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&c);
    std::__cxx11::string::~string((string *)&b);
  }
  lVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)&time_str);
  lVar2 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)&number_str);
  if (lVar1 == -1) {
    if (lVar2 == -1) goto LAB_00104ddc;
    b._M_dataplus._M_p = (pointer)&b.field_2;
    b._M_string_length = 0;
    c._M_dataplus._M_p = (pointer)&c.field_2;
    c._M_string_length = 0;
    b.field_2._M_local_buf[0] = '\0';
    c.field_2._M_local_buf[0] = '\0';
    if (lVar2 != 0) {
      std::__cxx11::string::substr((ulong)&local_150,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&b,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    if (number_str._M_string_length + lVar2 < __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_150,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&c,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::to_string(&local_d0,number);
    std::operator+(&local_f0,&b,&local_d0);
    std::operator+(&local_150,&local_f0,&c);
  }
  else {
    b._M_dataplus._M_p = (pointer)&b.field_2;
    b._M_string_length = 0;
    c._M_dataplus._M_p = (pointer)&c.field_2;
    c._M_string_length = 0;
    b.field_2._M_local_buf[0] = '\0';
    c.field_2._M_local_buf[0] = '\0';
    if (lVar1 != 0) {
      std::__cxx11::string::substr((ulong)&local_150,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&b,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    if (time_str._M_string_length + lVar1 < __return_storage_ptr__->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_150,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)&c,(string *)&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::to_string(&local_d0,time);
    std::operator+(&local_f0,&b,&local_d0);
    std::operator+(&local_150,&local_f0,&c);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&b);
LAB_00104ddc:
  std::__cxx11::string::~string((string *)&rep_name);
  std::__cxx11::string::~string((string *)&rep_str);
  std::__cxx11::string::~string((string *)&time_str);
  std::__cxx11::string::~string((string *)&number_str);
  return __return_storage_ptr__;
}

Assistant:

std::string get_path_from_template(
    std::string& template_string,
    std::string& file_name,
    uint64_t time,
    uint64_t number)
{
    std::string out_string;

    const std::string number_str = "$Number$";
    const std::string time_str = "$Time$";
    const std::string rep_str = "$RepresentationID$";

    std::string rep_name;

    if (file_name.size() > 0)
    {
        size_t poss = file_name.find_last_of(".");
        if (poss != std::string::npos)
            rep_name = file_name.substr(0, poss);
    }

    size_t rep_pos = template_string.find_first_of(rep_str);

    if (rep_pos != std::string::npos)
    {
        std::string b, c;

        if (rep_pos != 0)
            b = template_string.substr(0, rep_pos);

        if (rep_pos + rep_str.size() < template_string.size())
            c = template_string.substr(rep_pos + rep_str.size());

        out_string = b + rep_name + c;
    }

    size_t time_pos = out_string.find(time_str);
    size_t num_pos = out_string.find(number_str);

    if (time_pos != std::string::npos)
    {
        std::string b, c;

        if (time_pos != 0)
            b = out_string.substr(0, time_pos);

        if (time_pos + time_str.size() < out_string.size())
            c = out_string.substr(time_pos + time_str.size());

        out_string = b + std::to_string(time) + c;
    }
    else if (num_pos != std::string::npos)
    {
        std::string b, c;

        if (num_pos != 0)
            b = out_string.substr(0, num_pos);

        if (num_pos + number_str.size() < out_string.size())
            c = out_string.substr(num_pos + number_str.size());

        out_string = b + std::to_string(number) + c;
    }

    return out_string;
}